

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofiletools.cpp
# Opt level: O3

string * __thiscall
libcellml::generatorProfileAsString_abi_cxx11_
          (string *__return_storage_ptr__,libcellml *this,GeneratorProfilePtr *generatorProfile)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong *puVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  pointer pcVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  string *psVar10;
  undefined8 *puVar11;
  long *plVar12;
  size_type *psVar13;
  string *__rhs;
  undefined8 uVar14;
  string *psVar15;
  string local_618;
  string local_5f8;
  string local_5d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_5b8;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)::
       TRUE_VALUE_abi_cxx11_ == '\0') &&
     (iVar9 = __cxa_guard_acquire(&generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                                   ::TRUE_VALUE_abi_cxx11_), iVar9 != 0)) {
    generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)::
    TRUE_VALUE_abi_cxx11_._M_dataplus._M_p =
         (pointer)&generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                   ::TRUE_VALUE_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                ::TRUE_VALUE_abi_cxx11_,"true","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                  ::TRUE_VALUE_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                         ::TRUE_VALUE_abi_cxx11_);
  }
  if ((generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)::
       FALSE_VALUE_abi_cxx11_ == '\0') &&
     (iVar9 = __cxa_guard_acquire(&generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                                   ::FALSE_VALUE_abi_cxx11_), iVar9 != 0)) {
    generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)::
    FALSE_VALUE_abi_cxx11_._M_dataplus._M_p =
         (pointer)&generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                   ::FALSE_VALUE_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                ::FALSE_VALUE_abi_cxx11_,"false","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                  ::FALSE_VALUE_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                         ::FALSE_VALUE_abi_cxx11_);
  }
  bVar7 = GeneratorProfile::hasInterface(*(GeneratorProfile **)this);
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  psVar15 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
             ::FALSE_VALUE_abi_cxx11_;
  psVar10 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
             ::FALSE_VALUE_abi_cxx11_;
  if (bVar7) {
    psVar10 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
               ::TRUE_VALUE_abi_cxx11_;
  }
  pcVar6 = (psVar10->_M_dataplus)._M_p;
  psVar10 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
             ::FALSE_VALUE_abi_cxx11_;
  if (bVar7) {
    psVar10 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
               ::TRUE_VALUE_abi_cxx11_;
  }
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar6,pcVar6 + psVar10->_M_string_length);
  GeneratorProfile::equalityString_abi_cxx11_(&local_618,*(GeneratorProfile **)this);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  paVar3 = &local_618.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::eqString_abi_cxx11_(&local_4d0,*(GeneratorProfile **)this);
  GeneratorProfile::neqString_abi_cxx11_(&local_4f0,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    uVar14 = local_4d0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_4f0._M_string_length + local_4d0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
      uVar14 = local_4f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_4f0._M_string_length + local_4d0._M_string_length) goto LAB_0020f616;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_4f0,0,(char *)0x0,(ulong)local_4d0._M_dataplus._M_p);
  }
  else {
LAB_0020f616:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_4d0,(ulong)local_4f0._M_dataplus._M_p);
  }
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_510.field_2._M_allocated_capacity = *puVar2;
    local_510.field_2._8_8_ = puVar11[3];
  }
  else {
    local_510.field_2._M_allocated_capacity = *puVar2;
    local_510._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_510._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::ltString_abi_cxx11_(&local_4b0,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    uVar14 = local_510.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_4b0._M_string_length + local_510._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
      uVar14 = local_4b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_4b0._M_string_length + local_510._M_string_length) goto LAB_0020f6f3;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_4b0,0,(char *)0x0,(ulong)local_510._M_dataplus._M_p);
  }
  else {
LAB_0020f6f3:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_510,(ulong)local_4b0._M_dataplus._M_p);
  }
  local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_530.field_2._M_allocated_capacity = *puVar2;
    local_530.field_2._8_8_ = puVar11[3];
  }
  else {
    local_530.field_2._M_allocated_capacity = *puVar2;
    local_530._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_530._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::leqString_abi_cxx11_(&local_450,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    uVar14 = local_530.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_450._M_string_length + local_530._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      uVar14 = local_450.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_450._M_string_length + local_530._M_string_length) goto LAB_0020f7d0;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_450,0,(char *)0x0,(ulong)local_530._M_dataplus._M_p);
  }
  else {
LAB_0020f7d0:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_530,(ulong)local_450._M_dataplus._M_p);
  }
  local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_570.field_2._M_allocated_capacity = *puVar2;
    local_570.field_2._8_8_ = puVar11[3];
  }
  else {
    local_570.field_2._M_allocated_capacity = *puVar2;
    local_570._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_570._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::gtString_abi_cxx11_(&local_470,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    uVar14 = local_570.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_470._M_string_length + local_570._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_dataplus._M_p != &local_470.field_2) {
      uVar14 = local_470.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_470._M_string_length + local_570._M_string_length) goto LAB_0020f8ad;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_470,0,(char *)0x0,(ulong)local_570._M_dataplus._M_p);
  }
  else {
LAB_0020f8ad:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_570,(ulong)local_470._M_dataplus._M_p);
  }
  local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_550.field_2._M_allocated_capacity = *puVar2;
    local_550.field_2._8_8_ = puVar11[3];
  }
  else {
    local_550.field_2._M_allocated_capacity = *puVar2;
    local_550._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_550._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::geqString_abi_cxx11_(&local_490,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    uVar14 = local_550.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_490._M_string_length + local_550._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490._M_dataplus._M_p != &local_490.field_2) {
      uVar14 = local_490.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_490._M_string_length + local_550._M_string_length) goto LAB_0020f98a;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_490,0,(char *)0x0,(ulong)local_550._M_dataplus._M_p);
  }
  else {
LAB_0020f98a:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_550,(ulong)local_490._M_dataplus._M_p);
  }
  local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_5b0.field_2._M_allocated_capacity = *puVar2;
    local_5b0.field_2._8_8_ = puVar11[3];
  }
  else {
    local_5b0.field_2._M_allocated_capacity = *puVar2;
    local_5b0._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_5b0._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::andString_abi_cxx11_(&local_3d0,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    uVar14 = local_5b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_3d0._M_string_length + local_5b0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
      uVar14 = local_3d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_3d0._M_string_length + local_5b0._M_string_length) goto LAB_0020fa55;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_3d0,0,(char *)0x0,(ulong)local_5b0._M_dataplus._M_p);
  }
  else {
LAB_0020fa55:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5b0,(ulong)local_3d0._M_dataplus._M_p);
  }
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_590.field_2._M_allocated_capacity = *puVar2;
    local_590.field_2._8_8_ = puVar11[3];
  }
  else {
    local_590.field_2._M_allocated_capacity = *puVar2;
    local_590._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_590._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::orString_abi_cxx11_(&local_3f0,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    uVar14 = local_590.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_3f0._M_string_length + local_590._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      uVar14 = local_3f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_3f0._M_string_length + local_590._M_string_length) goto LAB_0020fb2f;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_3f0,0,(char *)0x0,(ulong)local_590._M_dataplus._M_p);
  }
  else {
LAB_0020fb2f:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_590,(ulong)local_3f0._M_dataplus._M_p);
  }
  local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_5f8.field_2._M_allocated_capacity = *puVar2;
    local_5f8.field_2._8_8_ = puVar11[3];
  }
  else {
    local_5f8.field_2._M_allocated_capacity = *puVar2;
    local_5f8._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_5f8._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::xorString_abi_cxx11_(&local_410,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    uVar14 = local_5f8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_410._M_string_length + local_5f8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      uVar14 = local_410.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_410._M_string_length + local_5f8._M_string_length) goto LAB_0020fbfa;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_410,0,(char *)0x0,(ulong)local_5f8._M_dataplus._M_p);
  }
  else {
LAB_0020fbfa:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5f8,(ulong)local_410._M_dataplus._M_p);
  }
  local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_5d8.field_2._M_allocated_capacity = *puVar2;
    local_5d8.field_2._8_8_ = puVar11[3];
  }
  else {
    local_5d8.field_2._M_allocated_capacity = *puVar2;
    local_5d8._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_5d8._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::notString_abi_cxx11_(&local_430,*(GeneratorProfile **)this);
  paVar4 = &local_5d8.field_2;
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_430._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      uVar14 = local_430.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_430._M_string_length + local_5d8._M_string_length) goto LAB_0020fcc4;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_430,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_0020fcc4:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_430._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  local_5b8 = paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  bVar7 = GeneratorProfile::hasEqOperator(*(GeneratorProfile **)this);
  bVar8 = GeneratorProfile::hasNeqOperator(*(GeneratorProfile **)this);
  psVar10 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
             ::FALSE_VALUE_abi_cxx11_;
  if (bVar7) {
    psVar10 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
               ::TRUE_VALUE_abi_cxx11_;
  }
  __rhs = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)::
           FALSE_VALUE_abi_cxx11_;
  if (bVar8) {
    __rhs = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
             ::TRUE_VALUE_abi_cxx11_;
  }
  std::operator+(&local_510,psVar10,__rhs);
  bVar7 = GeneratorProfile::hasLtOperator(*(GeneratorProfile **)this);
  psVar10 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
             ::FALSE_VALUE_abi_cxx11_;
  if (bVar7) {
    psVar10 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
               ::TRUE_VALUE_abi_cxx11_;
  }
  plVar12 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_510,(ulong)(psVar10->_M_dataplus)._M_p);
  local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
  psVar13 = (size_type *)(plVar12 + 2);
  paVar1 = &local_5f8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_530.field_2._M_allocated_capacity = *psVar13;
    local_530.field_2._8_8_ = plVar12[3];
  }
  else {
    local_530.field_2._M_allocated_capacity = *psVar13;
    local_530._M_dataplus._M_p = (pointer)*plVar12;
  }
  local_530._M_string_length = plVar12[1];
  *plVar12 = (long)psVar13;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  bVar7 = GeneratorProfile::hasLeqOperator(*(GeneratorProfile **)this);
  psVar10 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
             ::FALSE_VALUE_abi_cxx11_;
  if (bVar7) {
    psVar10 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
               ::TRUE_VALUE_abi_cxx11_;
  }
  plVar12 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_530,(ulong)(psVar10->_M_dataplus)._M_p);
  local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
  psVar13 = (size_type *)(plVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_570.field_2._M_allocated_capacity = *psVar13;
    local_570.field_2._8_8_ = plVar12[3];
  }
  else {
    local_570.field_2._M_allocated_capacity = *psVar13;
    local_570._M_dataplus._M_p = (pointer)*plVar12;
  }
  local_570._M_string_length = plVar12[1];
  *plVar12 = (long)psVar13;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  bVar7 = GeneratorProfile::hasGtOperator(*(GeneratorProfile **)this);
  psVar10 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
             ::FALSE_VALUE_abi_cxx11_;
  if (bVar7) {
    psVar10 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
               ::TRUE_VALUE_abi_cxx11_;
  }
  plVar12 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_570,(ulong)(psVar10->_M_dataplus)._M_p);
  local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
  psVar13 = (size_type *)(plVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_550.field_2._M_allocated_capacity = *psVar13;
    local_550.field_2._8_8_ = plVar12[3];
  }
  else {
    local_550.field_2._M_allocated_capacity = *psVar13;
    local_550._M_dataplus._M_p = (pointer)*plVar12;
  }
  local_550._M_string_length = plVar12[1];
  *plVar12 = (long)psVar13;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  bVar7 = GeneratorProfile::hasGeqOperator(*(GeneratorProfile **)this);
  psVar10 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
             ::FALSE_VALUE_abi_cxx11_;
  if (bVar7) {
    psVar10 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
               ::TRUE_VALUE_abi_cxx11_;
  }
  plVar12 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_550,(ulong)(psVar10->_M_dataplus)._M_p);
  local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
  psVar13 = (size_type *)(plVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_5b0.field_2._M_allocated_capacity = *psVar13;
    local_5b0.field_2._8_8_ = plVar12[3];
  }
  else {
    local_5b0.field_2._M_allocated_capacity = *psVar13;
    local_5b0._M_dataplus._M_p = (pointer)*plVar12;
  }
  local_5b0._M_string_length = plVar12[1];
  *plVar12 = (long)psVar13;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  bVar7 = GeneratorProfile::hasAndOperator(*(GeneratorProfile **)this);
  psVar10 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
             ::FALSE_VALUE_abi_cxx11_;
  if (bVar7) {
    psVar10 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
               ::TRUE_VALUE_abi_cxx11_;
  }
  plVar12 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_5b0,(ulong)(psVar10->_M_dataplus)._M_p);
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  psVar13 = (size_type *)(plVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_590.field_2._M_allocated_capacity = *psVar13;
    local_590.field_2._8_8_ = plVar12[3];
  }
  else {
    local_590.field_2._M_allocated_capacity = *psVar13;
    local_590._M_dataplus._M_p = (pointer)*plVar12;
  }
  local_590._M_string_length = plVar12[1];
  *plVar12 = (long)psVar13;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  bVar7 = GeneratorProfile::hasOrOperator(*(GeneratorProfile **)this);
  psVar10 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
             ::FALSE_VALUE_abi_cxx11_;
  if (bVar7) {
    psVar10 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
               ::TRUE_VALUE_abi_cxx11_;
  }
  plVar12 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_590,(ulong)(psVar10->_M_dataplus)._M_p);
  psVar13 = (size_type *)(plVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_5f8.field_2._M_allocated_capacity = *psVar13;
    local_5f8.field_2._8_8_ = plVar12[3];
    local_5f8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_5f8.field_2._M_allocated_capacity = *psVar13;
    local_5f8._M_dataplus._M_p = (pointer)*plVar12;
  }
  local_5f8._M_string_length = plVar12[1];
  *plVar12 = (long)psVar13;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  bVar7 = GeneratorProfile::hasXorOperator(*(GeneratorProfile **)this);
  psVar10 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
             ::FALSE_VALUE_abi_cxx11_;
  if (bVar7) {
    psVar10 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
               ::TRUE_VALUE_abi_cxx11_;
  }
  plVar12 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_5f8,(ulong)(psVar10->_M_dataplus)._M_p);
  psVar13 = (size_type *)(plVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_5d8.field_2._M_allocated_capacity = *psVar13;
    local_5d8.field_2._8_8_ = plVar12[3];
    local_5d8._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_5d8.field_2._M_allocated_capacity = *psVar13;
    local_5d8._M_dataplus._M_p = (pointer)*plVar12;
  }
  local_5d8._M_string_length = plVar12[1];
  *plVar12 = (long)psVar13;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  bVar7 = GeneratorProfile::hasNotOperator(*(GeneratorProfile **)this);
  psVar10 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
             ::FALSE_VALUE_abi_cxx11_;
  if (bVar7) {
    psVar10 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
               ::TRUE_VALUE_abi_cxx11_;
  }
  plVar12 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_5d8,(ulong)(psVar10->_M_dataplus)._M_p);
  psVar13 = (size_type *)(plVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = plVar12[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*plVar12;
  }
  local_618._M_string_length = plVar12[1];
  *plVar12 = (long)psVar13;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::plusString_abi_cxx11_(&local_3d0,*(GeneratorProfile **)this);
  GeneratorProfile::minusString_abi_cxx11_(&local_3f0,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    uVar14 = local_3d0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_3f0._M_string_length + local_3d0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      uVar14 = local_3f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_3f0._M_string_length + local_3d0._M_string_length) goto LAB_002105cd;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_3f0,0,(char *)0x0,(ulong)local_3d0._M_dataplus._M_p);
  }
  else {
LAB_002105cd:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_3d0,(ulong)local_3f0._M_dataplus._M_p);
  }
  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_490.field_2._M_allocated_capacity = *puVar2;
    local_490.field_2._8_8_ = puVar11[3];
  }
  else {
    local_490.field_2._M_allocated_capacity = *puVar2;
    local_490._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_490._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::timesString_abi_cxx11_(&local_410,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    uVar14 = local_490.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_410._M_string_length + local_490._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      uVar14 = local_410.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_410._M_string_length + local_490._M_string_length) goto LAB_002106b6;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_410,0,(char *)0x0,(ulong)local_490._M_dataplus._M_p);
  }
  else {
LAB_002106b6:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_490,(ulong)local_410._M_dataplus._M_p);
  }
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_470.field_2._M_allocated_capacity = *puVar2;
    local_470.field_2._8_8_ = puVar11[3];
  }
  else {
    local_470.field_2._M_allocated_capacity = *puVar2;
    local_470._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_470._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::divideString_abi_cxx11_(&local_430,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    uVar14 = local_470.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_430._M_string_length + local_470._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      uVar14 = local_430.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_430._M_string_length + local_470._M_string_length) goto LAB_0021079f;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_430,0,(char *)0x0,(ulong)local_470._M_dataplus._M_p);
  }
  else {
LAB_0021079f:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_470,(ulong)local_430._M_dataplus._M_p);
  }
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_450.field_2._M_allocated_capacity = *puVar2;
    local_450.field_2._8_8_ = puVar11[3];
  }
  else {
    local_450.field_2._M_allocated_capacity = *puVar2;
    local_450._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_450._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::powerString_abi_cxx11_(&local_350,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    uVar14 = local_450.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_350._M_string_length + local_450._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      uVar14 = local_350.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_350._M_string_length + local_450._M_string_length) goto LAB_00210888;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_350,0,(char *)0x0,(ulong)local_450._M_dataplus._M_p);
  }
  else {
LAB_00210888:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_450,(ulong)local_350._M_dataplus._M_p);
  }
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_4b0.field_2._M_allocated_capacity = *puVar2;
    local_4b0.field_2._8_8_ = puVar11[3];
  }
  else {
    local_4b0.field_2._M_allocated_capacity = *puVar2;
    local_4b0._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_4b0._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::squareRootString_abi_cxx11_(&local_370,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    uVar14 = local_4b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_370._M_string_length + local_4b0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      uVar14 = local_370.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_370._M_string_length + local_4b0._M_string_length) goto LAB_00210971;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_370,0,(char *)0x0,(ulong)local_4b0._M_dataplus._M_p);
  }
  else {
LAB_00210971:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_4b0,(ulong)local_370._M_dataplus._M_p);
  }
  local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_4f0.field_2._M_allocated_capacity = *puVar2;
    local_4f0.field_2._8_8_ = puVar11[3];
  }
  else {
    local_4f0.field_2._M_allocated_capacity = *puVar2;
    local_4f0._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_4f0._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::squareString_abi_cxx11_(&local_390,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    uVar14 = local_4f0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_390._M_string_length + local_4f0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      uVar14 = local_390.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_390._M_string_length + local_4f0._M_string_length) goto LAB_00210a5a;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_390,0,(char *)0x0,(ulong)local_4f0._M_dataplus._M_p);
  }
  else {
LAB_00210a5a:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_4f0,(ulong)local_390._M_dataplus._M_p);
  }
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_4d0.field_2._M_allocated_capacity = *puVar2;
    local_4d0.field_2._8_8_ = puVar11[3];
  }
  else {
    local_4d0.field_2._M_allocated_capacity = *puVar2;
    local_4d0._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_4d0._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::absoluteValueString_abi_cxx11_(&local_3b0,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    uVar14 = local_4d0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_3b0._M_string_length + local_4d0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      uVar14 = local_3b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_3b0._M_string_length + local_4d0._M_string_length) goto LAB_00210b43;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_3b0,0,(char *)0x0,(ulong)local_4d0._M_dataplus._M_p);
  }
  else {
LAB_00210b43:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_4d0,(ulong)local_3b0._M_dataplus._M_p);
  }
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_510.field_2._M_allocated_capacity = *puVar2;
    local_510.field_2._8_8_ = puVar11[3];
  }
  else {
    local_510.field_2._M_allocated_capacity = *puVar2;
    local_510._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_510._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::exponentialString_abi_cxx11_(&local_310,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    uVar14 = local_510.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_310._M_string_length + local_510._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      uVar14 = local_310.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_310._M_string_length + local_510._M_string_length) goto LAB_00210c2c;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_310,0,(char *)0x0,(ulong)local_510._M_dataplus._M_p);
  }
  else {
LAB_00210c2c:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_510,(ulong)local_310._M_dataplus._M_p);
  }
  local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_530.field_2._M_allocated_capacity = *puVar2;
    local_530.field_2._8_8_ = puVar11[3];
  }
  else {
    local_530.field_2._M_allocated_capacity = *puVar2;
    local_530._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_530._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::naturalLogarithmString_abi_cxx11_(&local_330,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    uVar14 = local_530.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_330._M_string_length + local_530._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      uVar14 = local_330.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_330._M_string_length + local_530._M_string_length) goto LAB_00210d15;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_330,0,(char *)0x0,(ulong)local_530._M_dataplus._M_p);
  }
  else {
LAB_00210d15:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_530,(ulong)local_330._M_dataplus._M_p);
  }
  local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_570.field_2._M_allocated_capacity = *puVar2;
    local_570.field_2._8_8_ = puVar11[3];
  }
  else {
    local_570.field_2._M_allocated_capacity = *puVar2;
    local_570._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_570._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::commonLogarithmString_abi_cxx11_(&local_270,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    uVar14 = local_570.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_270._M_string_length + local_570._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      uVar14 = local_270.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_270._M_string_length + local_570._M_string_length) goto LAB_00210dfe;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_270,0,(char *)0x0,(ulong)local_570._M_dataplus._M_p);
  }
  else {
LAB_00210dfe:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_570,(ulong)local_270._M_dataplus._M_p);
  }
  local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_550.field_2._M_allocated_capacity = *puVar2;
    local_550.field_2._8_8_ = puVar11[3];
  }
  else {
    local_550.field_2._M_allocated_capacity = *puVar2;
    local_550._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_550._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::ceilingString_abi_cxx11_(&local_290,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    uVar14 = local_550.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_290._M_string_length + local_550._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      uVar14 = local_290.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_290._M_string_length + local_550._M_string_length) goto LAB_00210ee7;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_290,0,(char *)0x0,(ulong)local_550._M_dataplus._M_p);
  }
  else {
LAB_00210ee7:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_550,(ulong)local_290._M_dataplus._M_p);
  }
  local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_5b0.field_2._M_allocated_capacity = *puVar2;
    local_5b0.field_2._8_8_ = puVar11[3];
  }
  else {
    local_5b0.field_2._M_allocated_capacity = *puVar2;
    local_5b0._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_5b0._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::floorString_abi_cxx11_(&local_2b0,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    uVar14 = local_5b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_2b0._M_string_length + local_5b0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      uVar14 = local_2b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_2b0._M_string_length + local_5b0._M_string_length) goto LAB_00210fb5;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_2b0,0,(char *)0x0,(ulong)local_5b0._M_dataplus._M_p);
  }
  else {
LAB_00210fb5:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5b0,(ulong)local_2b0._M_dataplus._M_p);
  }
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_590.field_2._M_allocated_capacity = *puVar2;
    local_590.field_2._8_8_ = puVar11[3];
  }
  else {
    local_590.field_2._M_allocated_capacity = *puVar2;
    local_590._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_590._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::minString_abi_cxx11_(&local_2d0,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    uVar14 = local_590.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_2d0._M_string_length + local_590._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      uVar14 = local_2d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_2d0._M_string_length + local_590._M_string_length) goto LAB_0021109b;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_2d0,0,(char *)0x0,(ulong)local_590._M_dataplus._M_p);
  }
  else {
LAB_0021109b:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_590,(ulong)local_2d0._M_dataplus._M_p);
  }
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_5f8.field_2._M_allocated_capacity = *puVar2;
    local_5f8.field_2._8_8_ = puVar11[3];
    local_5f8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_5f8.field_2._M_allocated_capacity = *puVar2;
    local_5f8._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_5f8._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::maxString_abi_cxx11_(&local_2f0,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar1) {
    uVar14 = local_5f8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_2f0._M_string_length + local_5f8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      uVar14 = local_2f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_2f0._M_string_length + local_5f8._M_string_length) goto LAB_00211160;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_2f0,0,(char *)0x0,(ulong)local_5f8._M_dataplus._M_p);
  }
  else {
LAB_00211160:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5f8,(ulong)local_2f0._M_dataplus._M_p);
  }
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_5d8.field_2._M_allocated_capacity = *puVar2;
    local_5d8.field_2._8_8_ = puVar11[3];
    local_5d8._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_5d8.field_2._M_allocated_capacity = *puVar2;
    local_5d8._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_5d8._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::remString_abi_cxx11_(&local_250,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_250._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      uVar14 = local_250.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_250._M_string_length + local_5d8._M_string_length) goto LAB_00211223;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_250,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_00211223:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_250._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_250.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != paVar1) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  bVar7 = GeneratorProfile::hasPowerOperator(*(GeneratorProfile **)this);
  psVar10 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
             ::FALSE_VALUE_abi_cxx11_;
  if (bVar7) {
    psVar10 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
               ::TRUE_VALUE_abi_cxx11_;
  }
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)(psVar10->_M_dataplus)._M_p)
  ;
  GeneratorProfile::sinString_abi_cxx11_(&local_310,*(GeneratorProfile **)this);
  GeneratorProfile::cosString_abi_cxx11_(&local_330,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    uVar14 = local_310.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_330._M_string_length + local_310._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      uVar14 = local_330.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_330._M_string_length + local_310._M_string_length) goto LAB_00211769;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_330,0,(char *)0x0,(ulong)local_310._M_dataplus._M_p);
  }
  else {
LAB_00211769:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_310,(ulong)local_330._M_dataplus._M_p);
  }
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_3b0.field_2._M_allocated_capacity = *puVar2;
    local_3b0.field_2._8_8_ = puVar11[3];
  }
  else {
    local_3b0.field_2._M_allocated_capacity = *puVar2;
    local_3b0._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_3b0._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::tanString_abi_cxx11_(&local_270,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    uVar14 = local_3b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_270._M_string_length + local_3b0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      uVar14 = local_270.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_270._M_string_length + local_3b0._M_string_length) goto LAB_00211852;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_270,0,(char *)0x0,(ulong)local_3b0._M_dataplus._M_p);
  }
  else {
LAB_00211852:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_3b0,(ulong)local_270._M_dataplus._M_p);
  }
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_390.field_2._M_allocated_capacity = *puVar2;
    local_390.field_2._8_8_ = puVar11[3];
  }
  else {
    local_390.field_2._M_allocated_capacity = *puVar2;
    local_390._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_390._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::secString_abi_cxx11_(&local_290,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    uVar14 = local_390.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_290._M_string_length + local_390._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      uVar14 = local_290.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_290._M_string_length + local_390._M_string_length) goto LAB_0021193b;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_290,0,(char *)0x0,(ulong)local_390._M_dataplus._M_p);
  }
  else {
LAB_0021193b:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_390,(ulong)local_290._M_dataplus._M_p);
  }
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_370.field_2._M_allocated_capacity = *puVar2;
    local_370.field_2._8_8_ = puVar11[3];
  }
  else {
    local_370.field_2._M_allocated_capacity = *puVar2;
    local_370._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_370._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::cscString_abi_cxx11_(&local_2b0,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    uVar14 = local_370.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_2b0._M_string_length + local_370._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      uVar14 = local_2b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_2b0._M_string_length + local_370._M_string_length) goto LAB_00211a24;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_2b0,0,(char *)0x0,(ulong)local_370._M_dataplus._M_p);
  }
  else {
LAB_00211a24:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_370,(ulong)local_2b0._M_dataplus._M_p);
  }
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_350.field_2._M_allocated_capacity = *puVar2;
    local_350.field_2._8_8_ = puVar11[3];
  }
  else {
    local_350.field_2._M_allocated_capacity = *puVar2;
    local_350._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_350._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::cotString_abi_cxx11_(&local_2d0,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    uVar14 = local_350.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_2d0._M_string_length + local_350._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      uVar14 = local_2d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_2d0._M_string_length + local_350._M_string_length) goto LAB_00211b0d;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_2d0,0,(char *)0x0,(ulong)local_350._M_dataplus._M_p);
  }
  else {
LAB_00211b0d:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_350,(ulong)local_2d0._M_dataplus._M_p);
  }
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_430.field_2._M_allocated_capacity = *puVar2;
    local_430.field_2._8_8_ = puVar11[3];
  }
  else {
    local_430.field_2._M_allocated_capacity = *puVar2;
    local_430._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_430._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::sinhString_abi_cxx11_(&local_2f0,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    uVar14 = local_430.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_2f0._M_string_length + local_430._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      uVar14 = local_2f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_2f0._M_string_length + local_430._M_string_length) goto LAB_00211bf6;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_2f0,0,(char *)0x0,(ulong)local_430._M_dataplus._M_p);
  }
  else {
LAB_00211bf6:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_430,(ulong)local_2f0._M_dataplus._M_p);
  }
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_410.field_2._M_allocated_capacity = *puVar2;
    local_410.field_2._8_8_ = puVar11[3];
  }
  else {
    local_410.field_2._M_allocated_capacity = *puVar2;
    local_410._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_410._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::coshString_abi_cxx11_(&local_250,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    uVar14 = local_410.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_250._M_string_length + local_410._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != paVar1) {
      uVar14 = local_250.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_250._M_string_length + local_410._M_string_length) goto LAB_00211cd7;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_250,0,(char *)0x0,(ulong)local_410._M_dataplus._M_p);
  }
  else {
LAB_00211cd7:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_410,(ulong)local_250._M_dataplus._M_p);
  }
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_3f0.field_2._M_allocated_capacity = *puVar2;
    local_3f0.field_2._8_8_ = puVar11[3];
  }
  else {
    local_3f0.field_2._M_allocated_capacity = *puVar2;
    local_3f0._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_3f0._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::tanhString_abi_cxx11_(&local_50,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    uVar14 = local_3f0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_50._M_string_length + local_3f0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      uVar14 = local_50.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_50._M_string_length + local_3f0._M_string_length) goto LAB_00211dc0;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_50,0,(char *)0x0,(ulong)local_3f0._M_dataplus._M_p);
  }
  else {
LAB_00211dc0:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_3f0,(ulong)local_50._M_dataplus._M_p);
  }
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_3d0.field_2._M_allocated_capacity = *puVar2;
    local_3d0.field_2._8_8_ = puVar11[3];
  }
  else {
    local_3d0.field_2._M_allocated_capacity = *puVar2;
    local_3d0._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_3d0._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::sechString_abi_cxx11_(&local_70,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    uVar14 = local_3d0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_70._M_string_length + local_3d0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      uVar14 = local_70.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_70._M_string_length + local_3d0._M_string_length) goto LAB_00211ea9;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_70,0,(char *)0x0,(ulong)local_3d0._M_dataplus._M_p);
  }
  else {
LAB_00211ea9:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_3d0,(ulong)local_70._M_dataplus._M_p);
  }
  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_490.field_2._M_allocated_capacity = *puVar2;
    local_490.field_2._8_8_ = puVar11[3];
  }
  else {
    local_490.field_2._M_allocated_capacity = *puVar2;
    local_490._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_490._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::cschString_abi_cxx11_(&local_90,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    uVar14 = local_490.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_90._M_string_length + local_490._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar14 = local_90.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_90._M_string_length + local_490._M_string_length) goto LAB_00211f92;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_90,0,(char *)0x0,(ulong)local_490._M_dataplus._M_p);
  }
  else {
LAB_00211f92:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_490,(ulong)local_90._M_dataplus._M_p);
  }
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_470.field_2._M_allocated_capacity = *puVar2;
    local_470.field_2._8_8_ = puVar11[3];
  }
  else {
    local_470.field_2._M_allocated_capacity = *puVar2;
    local_470._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_470._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::cothString_abi_cxx11_(&local_b0,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    uVar14 = local_470.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_b0._M_string_length + local_470._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar14 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_b0._M_string_length + local_470._M_string_length) goto LAB_0021207b;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_b0,0,(char *)0x0,(ulong)local_470._M_dataplus._M_p);
  }
  else {
LAB_0021207b:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_470,(ulong)local_b0._M_dataplus._M_p);
  }
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_450.field_2._M_allocated_capacity = *puVar2;
    local_450.field_2._8_8_ = puVar11[3];
  }
  else {
    local_450.field_2._M_allocated_capacity = *puVar2;
    local_450._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_450._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::asinString_abi_cxx11_(&local_d0,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    uVar14 = local_450.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_d0._M_string_length + local_450._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar14 = local_d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_d0._M_string_length + local_450._M_string_length) goto LAB_00212164;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_d0,0,(char *)0x0,(ulong)local_450._M_dataplus._M_p);
  }
  else {
LAB_00212164:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_450,(ulong)local_d0._M_dataplus._M_p);
  }
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_4b0.field_2._M_allocated_capacity = *puVar2;
    local_4b0.field_2._8_8_ = puVar11[3];
  }
  else {
    local_4b0.field_2._M_allocated_capacity = *puVar2;
    local_4b0._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_4b0._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::acosString_abi_cxx11_(&local_f0,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    uVar14 = local_4b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_f0._M_string_length + local_4b0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar14 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_f0._M_string_length + local_4b0._M_string_length) goto LAB_0021224d;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_f0,0,(char *)0x0,(ulong)local_4b0._M_dataplus._M_p);
  }
  else {
LAB_0021224d:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_4b0,(ulong)local_f0._M_dataplus._M_p);
  }
  local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_4f0.field_2._M_allocated_capacity = *puVar2;
    local_4f0.field_2._8_8_ = puVar11[3];
  }
  else {
    local_4f0.field_2._M_allocated_capacity = *puVar2;
    local_4f0._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_4f0._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::atanString_abi_cxx11_(&local_110,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    uVar14 = local_4f0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_110._M_string_length + local_4f0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      uVar14 = local_110.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_110._M_string_length + local_4f0._M_string_length) goto LAB_00212336;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_110,0,(char *)0x0,(ulong)local_4f0._M_dataplus._M_p);
  }
  else {
LAB_00212336:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_4f0,(ulong)local_110._M_dataplus._M_p);
  }
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_4d0.field_2._M_allocated_capacity = *puVar2;
    local_4d0.field_2._8_8_ = puVar11[3];
  }
  else {
    local_4d0.field_2._M_allocated_capacity = *puVar2;
    local_4d0._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_4d0._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::asecString_abi_cxx11_(&local_130,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    uVar14 = local_4d0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_130._M_string_length + local_4d0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      uVar14 = local_130.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_130._M_string_length + local_4d0._M_string_length) goto LAB_0021241f;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_130,0,(char *)0x0,(ulong)local_4d0._M_dataplus._M_p);
  }
  else {
LAB_0021241f:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_4d0,(ulong)local_130._M_dataplus._M_p);
  }
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_510.field_2._M_allocated_capacity = *puVar2;
    local_510.field_2._8_8_ = puVar11[3];
  }
  else {
    local_510.field_2._M_allocated_capacity = *puVar2;
    local_510._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_510._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::acscString_abi_cxx11_(&local_150,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    uVar14 = local_510.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_150._M_string_length + local_510._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      uVar14 = local_150.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_150._M_string_length + local_510._M_string_length) goto LAB_00212508;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_150,0,(char *)0x0,(ulong)local_510._M_dataplus._M_p);
  }
  else {
LAB_00212508:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_510,(ulong)local_150._M_dataplus._M_p);
  }
  local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_530.field_2._M_allocated_capacity = *puVar2;
    local_530.field_2._8_8_ = puVar11[3];
  }
  else {
    local_530.field_2._M_allocated_capacity = *puVar2;
    local_530._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_530._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::acotString_abi_cxx11_(&local_170,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    uVar14 = local_530.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_170._M_string_length + local_530._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      uVar14 = local_170.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_170._M_string_length + local_530._M_string_length) goto LAB_002125f1;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_170,0,(char *)0x0,(ulong)local_530._M_dataplus._M_p);
  }
  else {
LAB_002125f1:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_530,(ulong)local_170._M_dataplus._M_p);
  }
  local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_570.field_2._M_allocated_capacity = *puVar2;
    local_570.field_2._8_8_ = puVar11[3];
  }
  else {
    local_570.field_2._M_allocated_capacity = *puVar2;
    local_570._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_570._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::asinhString_abi_cxx11_(&local_190,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    uVar14 = local_570.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_190._M_string_length + local_570._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      uVar14 = local_190.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_190._M_string_length + local_570._M_string_length) goto LAB_002126da;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_190,0,(char *)0x0,(ulong)local_570._M_dataplus._M_p);
  }
  else {
LAB_002126da:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_570,(ulong)local_190._M_dataplus._M_p);
  }
  local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_550.field_2._M_allocated_capacity = *puVar2;
    local_550.field_2._8_8_ = puVar11[3];
  }
  else {
    local_550.field_2._M_allocated_capacity = *puVar2;
    local_550._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_550._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::acoshString_abi_cxx11_(&local_1b0,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    uVar14 = local_550.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_1b0._M_string_length + local_550._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      uVar14 = local_1b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_1b0._M_string_length + local_550._M_string_length) goto LAB_002127c3;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_1b0,0,(char *)0x0,(ulong)local_550._M_dataplus._M_p);
  }
  else {
LAB_002127c3:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_550,(ulong)local_1b0._M_dataplus._M_p);
  }
  local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_5b0.field_2._M_allocated_capacity = *puVar2;
    local_5b0.field_2._8_8_ = puVar11[3];
  }
  else {
    local_5b0.field_2._M_allocated_capacity = *puVar2;
    local_5b0._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_5b0._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::atanhString_abi_cxx11_(&local_1d0,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    uVar14 = local_5b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_1d0._M_string_length + local_5b0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      uVar14 = local_1d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_1d0._M_string_length + local_5b0._M_string_length) goto LAB_00212891;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_1d0,0,(char *)0x0,(ulong)local_5b0._M_dataplus._M_p);
  }
  else {
LAB_00212891:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5b0,(ulong)local_1d0._M_dataplus._M_p);
  }
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_590.field_2._M_allocated_capacity = *puVar2;
    local_590.field_2._8_8_ = puVar11[3];
  }
  else {
    local_590.field_2._M_allocated_capacity = *puVar2;
    local_590._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_590._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::asechString_abi_cxx11_(&local_1f0,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    uVar14 = local_590.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_1f0._M_string_length + local_590._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      uVar14 = local_1f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_1f0._M_string_length + local_590._M_string_length) goto LAB_00212977;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_1f0,0,(char *)0x0,(ulong)local_590._M_dataplus._M_p);
  }
  else {
LAB_00212977:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_590,(ulong)local_1f0._M_dataplus._M_p);
  }
  local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_5f8.field_2._M_allocated_capacity = *puVar2;
    local_5f8.field_2._8_8_ = puVar11[3];
  }
  else {
    local_5f8.field_2._M_allocated_capacity = *puVar2;
    local_5f8._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_5f8._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::acschString_abi_cxx11_(&local_210,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    uVar14 = local_5f8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_210._M_string_length + local_5f8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      uVar14 = local_210.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_210._M_string_length + local_5f8._M_string_length) goto LAB_00212a45;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_210,0,(char *)0x0,(ulong)local_5f8._M_dataplus._M_p);
  }
  else {
LAB_00212a45:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5f8,(ulong)local_210._M_dataplus._M_p);
  }
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_5d8.field_2._M_allocated_capacity = *puVar2;
    local_5d8.field_2._8_8_ = puVar11[3];
    local_5d8._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_5d8.field_2._M_allocated_capacity = *puVar2;
    local_5d8._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_5d8._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::acothString_abi_cxx11_(&local_230,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_230._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      uVar14 = local_230.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_230._M_string_length + local_5d8._M_string_length) goto LAB_00212b08;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_230,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_00212b08:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_230._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != paVar1) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_5f8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::conditionalOperatorIfString_abi_cxx11_(&local_590,*(GeneratorProfile **)this);
  GeneratorProfile::conditionalOperatorElseString_abi_cxx11_(&local_5b0,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    uVar14 = local_590.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_5b0._M_string_length + local_590._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
      uVar14 = local_5b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_5b0._M_string_length + local_590._M_string_length) goto LAB_00213244;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_5b0,0,(char *)0x0,(ulong)local_590._M_dataplus._M_p);
  }
  else {
LAB_00213244:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_590,(ulong)local_5b0._M_dataplus._M_p);
  }
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_5f8.field_2._M_allocated_capacity = *puVar2;
    local_5f8.field_2._8_8_ = puVar11[3];
    local_5f8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_5f8.field_2._M_allocated_capacity = *puVar2;
    local_5f8._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_5f8._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::piecewiseIfString_abi_cxx11_(&local_550,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar1) {
    uVar14 = local_5f8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_550._M_string_length + local_5f8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_550._M_dataplus._M_p != &local_550.field_2) {
      uVar14 = local_550.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_550._M_string_length + local_5f8._M_string_length) goto LAB_00213306;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_550,0,(char *)0x0,(ulong)local_5f8._M_dataplus._M_p);
  }
  else {
LAB_00213306:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5f8,(ulong)local_550._M_dataplus._M_p);
  }
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_5d8.field_2._M_allocated_capacity = *puVar2;
    local_5d8.field_2._8_8_ = puVar11[3];
    local_5d8._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_5d8.field_2._M_allocated_capacity = *puVar2;
    local_5d8._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_5d8._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::piecewiseElseString_abi_cxx11_(&local_570,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_570._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_570._M_dataplus._M_p != &local_570.field_2) {
      uVar14 = local_570.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_570._M_string_length + local_5d8._M_string_length) goto LAB_002133c9;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_570,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_002133c9:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_570._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  bVar7 = GeneratorProfile::hasConditionalOperator(*(GeneratorProfile **)this);
  if (bVar7) {
    psVar15 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
               ::TRUE_VALUE_abi_cxx11_;
  }
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)(psVar15->_M_dataplus)._M_p)
  ;
  GeneratorProfile::trueString_abi_cxx11_(&local_550,*(GeneratorProfile **)this);
  GeneratorProfile::falseString_abi_cxx11_(&local_570,*(GeneratorProfile **)this);
  paVar1 = &local_4d0.field_2;
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    uVar14 = local_550.field_2._M_allocated_capacity;
  }
  paVar5 = &local_5f8.field_2;
  if ((ulong)uVar14 < local_570._M_string_length + local_550._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_570._M_dataplus._M_p != &local_570.field_2) {
      uVar14 = local_570.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_570._M_string_length + local_550._M_string_length) goto LAB_002135cd;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_570,0,(char *)0x0,(ulong)local_550._M_dataplus._M_p);
  }
  else {
LAB_002135cd:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_550,(ulong)local_570._M_dataplus._M_p);
  }
  local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_5b0.field_2._M_allocated_capacity = *puVar2;
    local_5b0.field_2._8_8_ = puVar11[3];
  }
  else {
    local_5b0.field_2._M_allocated_capacity = *puVar2;
    local_5b0._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_5b0._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::eString_abi_cxx11_(&local_530,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    uVar14 = local_5b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_530._M_string_length + local_5b0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_530._M_dataplus._M_p != &local_530.field_2) {
      uVar14 = local_530.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_530._M_string_length + local_5b0._M_string_length) goto LAB_0021369b;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_530,0,(char *)0x0,(ulong)local_5b0._M_dataplus._M_p);
  }
  else {
LAB_0021369b:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5b0,(ulong)local_530._M_dataplus._M_p);
  }
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_590.field_2._M_allocated_capacity = *puVar2;
    local_590.field_2._8_8_ = puVar11[3];
  }
  else {
    local_590.field_2._M_allocated_capacity = *puVar2;
    local_590._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_590._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::piString_abi_cxx11_(&local_510,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    uVar14 = local_590.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_510._M_string_length + local_590._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_510._M_dataplus._M_p != &local_510.field_2) {
      uVar14 = local_510.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_510._M_string_length + local_590._M_string_length) goto LAB_00213781;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_510,0,(char *)0x0,(ulong)local_590._M_dataplus._M_p);
  }
  else {
LAB_00213781:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_590,(ulong)local_510._M_dataplus._M_p);
  }
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_5f8.field_2._M_allocated_capacity = *puVar2;
    local_5f8.field_2._8_8_ = puVar11[3];
    local_5f8._M_dataplus._M_p = (pointer)paVar5;
  }
  else {
    local_5f8.field_2._M_allocated_capacity = *puVar2;
    local_5f8._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_5f8._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::infString_abi_cxx11_(&local_4d0,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    uVar14 = local_5f8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_4d0._M_string_length + local_5f8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d0._M_dataplus._M_p != paVar1) {
      uVar14 = local_4d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_4d0._M_string_length + local_5f8._M_string_length) goto LAB_0021383f;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_4d0,0,(char *)0x0,(ulong)local_5f8._M_dataplus._M_p);
  }
  else {
LAB_0021383f:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5f8,(ulong)local_4d0._M_dataplus._M_p);
  }
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_5d8.field_2._M_allocated_capacity = *puVar2;
    local_5d8.field_2._8_8_ = puVar11[3];
    local_5d8._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_5d8.field_2._M_allocated_capacity = *puVar2;
    local_5d8._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_5d8._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::nanString_abi_cxx11_(&local_4f0,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_4f0._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
      uVar14 = local_4f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_4f0._M_string_length + local_5d8._M_string_length) goto LAB_00213902;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_4f0,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_00213902:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_4f0._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::eqFunctionString_abi_cxx11_(&local_4b0,*(GeneratorProfile **)this);
  GeneratorProfile::neqFunctionString_abi_cxx11_(&local_450,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    uVar14 = local_4b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_450._M_string_length + local_4b0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      uVar14 = local_450.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_450._M_string_length + local_4b0._M_string_length) goto LAB_00213b4f;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_450,0,(char *)0x0,(ulong)local_4b0._M_dataplus._M_p);
  }
  else {
LAB_00213b4f:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_4b0,(ulong)local_450._M_dataplus._M_p);
  }
  local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_4f0.field_2._M_allocated_capacity = *puVar2;
    local_4f0.field_2._8_8_ = puVar11[3];
  }
  else {
    local_4f0.field_2._M_allocated_capacity = *puVar2;
    local_4f0._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_4f0._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::ltFunctionString_abi_cxx11_(&local_470,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    uVar14 = local_4f0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_470._M_string_length + local_4f0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_dataplus._M_p != &local_470.field_2) {
      uVar14 = local_470.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_470._M_string_length + local_4f0._M_string_length) goto LAB_00213c38;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_470,0,(char *)0x0,(ulong)local_4f0._M_dataplus._M_p);
  }
  else {
LAB_00213c38:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_4f0,(ulong)local_470._M_dataplus._M_p);
  }
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_4d0.field_2._M_allocated_capacity = *puVar2;
    local_4d0.field_2._8_8_ = puVar11[3];
    local_4d0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_4d0.field_2._M_allocated_capacity = *puVar2;
    local_4d0._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_4d0._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::leqFunctionString_abi_cxx11_(&local_490,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != paVar1) {
    uVar14 = local_4d0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_490._M_string_length + local_4d0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490._M_dataplus._M_p != &local_490.field_2) {
      uVar14 = local_490.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_490._M_string_length + local_4d0._M_string_length) goto LAB_00213d12;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_490,0,(char *)0x0,(ulong)local_4d0._M_dataplus._M_p);
  }
  else {
LAB_00213d12:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_4d0,(ulong)local_490._M_dataplus._M_p);
  }
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_510.field_2._M_allocated_capacity = *puVar2;
    local_510.field_2._8_8_ = puVar11[3];
  }
  else {
    local_510.field_2._M_allocated_capacity = *puVar2;
    local_510._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_510._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::gtFunctionString_abi_cxx11_(&local_3d0,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    uVar14 = local_510.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_3d0._M_string_length + local_510._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
      uVar14 = local_3d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_3d0._M_string_length + local_510._M_string_length) goto LAB_00213dfb;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_3d0,0,(char *)0x0,(ulong)local_510._M_dataplus._M_p);
  }
  else {
LAB_00213dfb:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_510,(ulong)local_3d0._M_dataplus._M_p);
  }
  local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_530.field_2._M_allocated_capacity = *puVar2;
    local_530.field_2._8_8_ = puVar11[3];
  }
  else {
    local_530.field_2._M_allocated_capacity = *puVar2;
    local_530._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_530._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::geqFunctionString_abi_cxx11_(&local_3f0,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    uVar14 = local_530.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_3f0._M_string_length + local_530._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      uVar14 = local_3f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_3f0._M_string_length + local_530._M_string_length) goto LAB_00213ee4;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_3f0,0,(char *)0x0,(ulong)local_530._M_dataplus._M_p);
  }
  else {
LAB_00213ee4:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_530,(ulong)local_3f0._M_dataplus._M_p);
  }
  local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_570.field_2._M_allocated_capacity = *puVar2;
    local_570.field_2._8_8_ = puVar11[3];
  }
  else {
    local_570.field_2._M_allocated_capacity = *puVar2;
    local_570._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_570._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::andFunctionString_abi_cxx11_(&local_410,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    uVar14 = local_570.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_410._M_string_length + local_570._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      uVar14 = local_410.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_410._M_string_length + local_570._M_string_length) goto LAB_00213fcd;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_410,0,(char *)0x0,(ulong)local_570._M_dataplus._M_p);
  }
  else {
LAB_00213fcd:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_570,(ulong)local_410._M_dataplus._M_p);
  }
  local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_550.field_2._M_allocated_capacity = *puVar2;
    local_550.field_2._8_8_ = puVar11[3];
  }
  else {
    local_550.field_2._M_allocated_capacity = *puVar2;
    local_550._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_550._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::orFunctionString_abi_cxx11_(&local_430,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    uVar14 = local_550.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_430._M_string_length + local_550._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      uVar14 = local_430.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_430._M_string_length + local_550._M_string_length) goto LAB_002140b6;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_430,0,(char *)0x0,(ulong)local_550._M_dataplus._M_p);
  }
  else {
LAB_002140b6:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_550,(ulong)local_430._M_dataplus._M_p);
  }
  local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_5b0.field_2._M_allocated_capacity = *puVar2;
    local_5b0.field_2._8_8_ = puVar11[3];
  }
  else {
    local_5b0.field_2._M_allocated_capacity = *puVar2;
    local_5b0._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_5b0._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::xorFunctionString_abi_cxx11_(&local_350,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    uVar14 = local_5b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_350._M_string_length + local_5b0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      uVar14 = local_350.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_350._M_string_length + local_5b0._M_string_length) goto LAB_00214184;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_350,0,(char *)0x0,(ulong)local_5b0._M_dataplus._M_p);
  }
  else {
LAB_00214184:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5b0,(ulong)local_350._M_dataplus._M_p);
  }
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_590.field_2._M_allocated_capacity = *puVar2;
    local_590.field_2._8_8_ = puVar11[3];
  }
  else {
    local_590.field_2._M_allocated_capacity = *puVar2;
    local_590._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_590._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::notFunctionString_abi_cxx11_(&local_370,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    uVar14 = local_590.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_370._M_string_length + local_590._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      uVar14 = local_370.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_370._M_string_length + local_590._M_string_length) goto LAB_0021426a;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_370,0,(char *)0x0,(ulong)local_590._M_dataplus._M_p);
  }
  else {
LAB_0021426a:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_590,(ulong)local_370._M_dataplus._M_p);
  }
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_5f8.field_2._M_allocated_capacity = *puVar2;
    local_5f8.field_2._8_8_ = puVar11[3];
    local_5f8._M_dataplus._M_p = (pointer)paVar5;
  }
  else {
    local_5f8.field_2._M_allocated_capacity = *puVar2;
    local_5f8._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_5f8._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::minFunctionString_abi_cxx11_(&local_390,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    uVar14 = local_5f8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_390._M_string_length + local_5f8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      uVar14 = local_390.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_390._M_string_length + local_5f8._M_string_length) goto LAB_00214330;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_390,0,(char *)0x0,(ulong)local_5f8._M_dataplus._M_p);
  }
  else {
LAB_00214330:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5f8,(ulong)local_390._M_dataplus._M_p);
  }
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_5d8.field_2._M_allocated_capacity = *puVar2;
    local_5d8.field_2._8_8_ = puVar11[3];
    local_5d8._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_5d8.field_2._M_allocated_capacity = *puVar2;
    local_5d8._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_5d8._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::maxFunctionString_abi_cxx11_(&local_3b0,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_3b0._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      uVar14 = local_3b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_3b0._M_string_length + local_5d8._M_string_length) goto LAB_002143f3;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_3b0,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_002143f3:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_3b0._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::secFunctionString_abi_cxx11_(&local_4b0,*(GeneratorProfile **)this);
  GeneratorProfile::cscFunctionString_abi_cxx11_(&local_450,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    uVar14 = local_4b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_450._M_string_length + local_4b0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      uVar14 = local_450.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_450._M_string_length + local_4b0._M_string_length) goto LAB_002147fc;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_450,0,(char *)0x0,(ulong)local_4b0._M_dataplus._M_p);
  }
  else {
LAB_002147fc:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_4b0,(ulong)local_450._M_dataplus._M_p);
  }
  local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_4f0.field_2._M_allocated_capacity = *puVar2;
    local_4f0.field_2._8_8_ = puVar11[3];
  }
  else {
    local_4f0.field_2._M_allocated_capacity = *puVar2;
    local_4f0._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_4f0._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::cotFunctionString_abi_cxx11_(&local_470,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    uVar14 = local_4f0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_470._M_string_length + local_4f0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_dataplus._M_p != &local_470.field_2) {
      uVar14 = local_470.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_470._M_string_length + local_4f0._M_string_length) goto LAB_002148e5;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_470,0,(char *)0x0,(ulong)local_4f0._M_dataplus._M_p);
  }
  else {
LAB_002148e5:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_4f0,(ulong)local_470._M_dataplus._M_p);
  }
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_4d0.field_2._M_allocated_capacity = *puVar2;
    local_4d0.field_2._8_8_ = puVar11[3];
    local_4d0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_4d0.field_2._M_allocated_capacity = *puVar2;
    local_4d0._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_4d0._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::sechFunctionString_abi_cxx11_(&local_490,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != paVar1) {
    uVar14 = local_4d0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_490._M_string_length + local_4d0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490._M_dataplus._M_p != &local_490.field_2) {
      uVar14 = local_490.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_490._M_string_length + local_4d0._M_string_length) goto LAB_002149bf;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_490,0,(char *)0x0,(ulong)local_4d0._M_dataplus._M_p);
  }
  else {
LAB_002149bf:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_4d0,(ulong)local_490._M_dataplus._M_p);
  }
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_510.field_2._M_allocated_capacity = *puVar2;
    local_510.field_2._8_8_ = puVar11[3];
  }
  else {
    local_510.field_2._M_allocated_capacity = *puVar2;
    local_510._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_510._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::cschFunctionString_abi_cxx11_(&local_3d0,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    uVar14 = local_510.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_3d0._M_string_length + local_510._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
      uVar14 = local_3d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_3d0._M_string_length + local_510._M_string_length) goto LAB_00214aa8;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_3d0,0,(char *)0x0,(ulong)local_510._M_dataplus._M_p);
  }
  else {
LAB_00214aa8:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_510,(ulong)local_3d0._M_dataplus._M_p);
  }
  local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_530.field_2._M_allocated_capacity = *puVar2;
    local_530.field_2._8_8_ = puVar11[3];
  }
  else {
    local_530.field_2._M_allocated_capacity = *puVar2;
    local_530._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_530._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::cothFunctionString_abi_cxx11_(&local_3f0,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    uVar14 = local_530.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_3f0._M_string_length + local_530._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      uVar14 = local_3f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_3f0._M_string_length + local_530._M_string_length) goto LAB_00214b91;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_3f0,0,(char *)0x0,(ulong)local_530._M_dataplus._M_p);
  }
  else {
LAB_00214b91:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_530,(ulong)local_3f0._M_dataplus._M_p);
  }
  local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_570.field_2._M_allocated_capacity = *puVar2;
    local_570.field_2._8_8_ = puVar11[3];
  }
  else {
    local_570.field_2._M_allocated_capacity = *puVar2;
    local_570._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_570._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::asecFunctionString_abi_cxx11_(&local_410,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    uVar14 = local_570.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_410._M_string_length + local_570._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      uVar14 = local_410.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_410._M_string_length + local_570._M_string_length) goto LAB_00214c7a;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_410,0,(char *)0x0,(ulong)local_570._M_dataplus._M_p);
  }
  else {
LAB_00214c7a:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_570,(ulong)local_410._M_dataplus._M_p);
  }
  local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_550.field_2._M_allocated_capacity = *puVar2;
    local_550.field_2._8_8_ = puVar11[3];
  }
  else {
    local_550.field_2._M_allocated_capacity = *puVar2;
    local_550._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_550._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::acscFunctionString_abi_cxx11_(&local_430,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    uVar14 = local_550.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_430._M_string_length + local_550._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      uVar14 = local_430.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_430._M_string_length + local_550._M_string_length) goto LAB_00214d63;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_430,0,(char *)0x0,(ulong)local_550._M_dataplus._M_p);
  }
  else {
LAB_00214d63:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_550,(ulong)local_430._M_dataplus._M_p);
  }
  local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_5b0.field_2._M_allocated_capacity = *puVar2;
    local_5b0.field_2._8_8_ = puVar11[3];
  }
  else {
    local_5b0.field_2._M_allocated_capacity = *puVar2;
    local_5b0._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_5b0._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::acotFunctionString_abi_cxx11_(&local_350,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    uVar14 = local_5b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_350._M_string_length + local_5b0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      uVar14 = local_350.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_350._M_string_length + local_5b0._M_string_length) goto LAB_00214e31;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_350,0,(char *)0x0,(ulong)local_5b0._M_dataplus._M_p);
  }
  else {
LAB_00214e31:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5b0,(ulong)local_350._M_dataplus._M_p);
  }
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_590.field_2._M_allocated_capacity = *puVar2;
    local_590.field_2._8_8_ = puVar11[3];
  }
  else {
    local_590.field_2._M_allocated_capacity = *puVar2;
    local_590._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_590._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::asechFunctionString_abi_cxx11_(&local_370,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    uVar14 = local_590.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_370._M_string_length + local_590._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      uVar14 = local_370.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_370._M_string_length + local_590._M_string_length) goto LAB_00214f17;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_370,0,(char *)0x0,(ulong)local_590._M_dataplus._M_p);
  }
  else {
LAB_00214f17:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_590,(ulong)local_370._M_dataplus._M_p);
  }
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_5f8.field_2._M_allocated_capacity = *puVar2;
    local_5f8.field_2._8_8_ = puVar11[3];
    local_5f8._M_dataplus._M_p = (pointer)paVar5;
  }
  else {
    local_5f8.field_2._M_allocated_capacity = *puVar2;
    local_5f8._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_5f8._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::acschFunctionString_abi_cxx11_(&local_390,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    uVar14 = local_5f8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_390._M_string_length + local_5f8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      uVar14 = local_390.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_390._M_string_length + local_5f8._M_string_length) goto LAB_00214fdd;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_390,0,(char *)0x0,(ulong)local_5f8._M_dataplus._M_p);
  }
  else {
LAB_00214fdd:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5f8,(ulong)local_390._M_dataplus._M_p);
  }
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_5d8.field_2._M_allocated_capacity = *puVar2;
    local_5d8.field_2._8_8_ = puVar11[3];
    local_5d8._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_5d8.field_2._M_allocated_capacity = *puVar2;
    local_5d8._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_5d8._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::acothFunctionString_abi_cxx11_(&local_3b0,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_3b0._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      uVar14 = local_3b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_3b0._M_string_length + local_5d8._M_string_length) goto LAB_002150a0;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_3b0,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_002150a0:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_3b0._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::commentString_abi_cxx11_(&local_5d8,*(GeneratorProfile **)this);
  GeneratorProfile::originCommentString_abi_cxx11_(&local_5f8,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != paVar5) {
      uVar14 = local_5f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) goto LAB_00215481;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_5f8,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_00215481:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_5f8._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::interfaceHeaderString_abi_cxx11_(&local_5d8,*(GeneratorProfile **)this);
  GeneratorProfile::implementationHeaderString_abi_cxx11_(&local_5f8,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != paVar5) {
      uVar14 = local_5f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) goto LAB_0021558c;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_5f8,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_0021558c:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_5f8._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::interfaceVersionString_abi_cxx11_(&local_5d8,*(GeneratorProfile **)this);
  GeneratorProfile::implementationVersionString_abi_cxx11_(&local_5f8,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != paVar5) {
      uVar14 = local_5f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) goto LAB_00215697;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_5f8,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_00215697:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_5f8._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::interfaceLibcellmlVersionString_abi_cxx11_
            (&local_5d8,*(GeneratorProfile **)this);
  GeneratorProfile::implementationLibcellmlVersionString_abi_cxx11_
            (&local_5f8,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != paVar5) {
      uVar14 = local_5f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) goto LAB_002157a2;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_5f8,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_002157a2:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_5f8._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::interfaceStateCountString_abi_cxx11_(&local_5d8,*(GeneratorProfile **)this);
  GeneratorProfile::implementationStateCountString_abi_cxx11_(&local_5f8,*(GeneratorProfile **)this)
  ;
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != paVar5) {
      uVar14 = local_5f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) goto LAB_002158ad;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_5f8,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_002158ad:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_5f8._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::interfaceVariableCountString_abi_cxx11_(&local_5d8,*(GeneratorProfile **)this);
  GeneratorProfile::implementationVariableCountString_abi_cxx11_
            (&local_5f8,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != paVar5) {
      uVar14 = local_5f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) goto LAB_002159b8;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_5f8,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_002159b8:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_5f8._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::variableTypeObjectString_abi_cxx11_
            (&local_618,*(GeneratorProfile **)this,false,false);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::variableTypeObjectString_abi_cxx11_
            (&local_618,*(GeneratorProfile **)this,false,true);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::variableTypeObjectString_abi_cxx11_
            (&local_618,*(GeneratorProfile **)this,true,false);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::variableTypeObjectString_abi_cxx11_
            (&local_618,*(GeneratorProfile **)this,true,true);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::variableOfIntegrationVariableTypeString_abi_cxx11_
            (&local_550,*(GeneratorProfile **)this);
  GeneratorProfile::stateVariableTypeString_abi_cxx11_(&local_570,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    uVar14 = local_550.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_570._M_string_length + local_550._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_570._M_dataplus._M_p != &local_570.field_2) {
      uVar14 = local_570.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_570._M_string_length + local_550._M_string_length) goto LAB_00215bcf;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_570,0,(char *)0x0,(ulong)local_550._M_dataplus._M_p);
  }
  else {
LAB_00215bcf:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_550,(ulong)local_570._M_dataplus._M_p);
  }
  local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_5b0.field_2._M_allocated_capacity = *puVar2;
    local_5b0.field_2._8_8_ = puVar11[3];
  }
  else {
    local_5b0.field_2._M_allocated_capacity = *puVar2;
    local_5b0._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_5b0._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::constantVariableTypeString_abi_cxx11_(&local_530,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    uVar14 = local_5b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_530._M_string_length + local_5b0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_530._M_dataplus._M_p != &local_530.field_2) {
      uVar14 = local_530.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_530._M_string_length + local_5b0._M_string_length) goto LAB_00215c9d;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_530,0,(char *)0x0,(ulong)local_5b0._M_dataplus._M_p);
  }
  else {
LAB_00215c9d:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5b0,(ulong)local_530._M_dataplus._M_p);
  }
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_590.field_2._M_allocated_capacity = *puVar2;
    local_590.field_2._8_8_ = puVar11[3];
  }
  else {
    local_590.field_2._M_allocated_capacity = *puVar2;
    local_590._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_590._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::computedConstantVariableTypeString_abi_cxx11_
            (&local_510,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    uVar14 = local_590.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_510._M_string_length + local_590._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_510._M_dataplus._M_p != &local_510.field_2) {
      uVar14 = local_510.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_510._M_string_length + local_590._M_string_length) goto LAB_00215d83;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_510,0,(char *)0x0,(ulong)local_590._M_dataplus._M_p);
  }
  else {
LAB_00215d83:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_590,(ulong)local_510._M_dataplus._M_p);
  }
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_5f8.field_2._M_allocated_capacity = *puVar2;
    local_5f8.field_2._8_8_ = puVar11[3];
    local_5f8._M_dataplus._M_p = (pointer)paVar5;
  }
  else {
    local_5f8.field_2._M_allocated_capacity = *puVar2;
    local_5f8._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_5f8._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::algebraicVariableTypeString_abi_cxx11_(&local_4d0,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    uVar14 = local_5f8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_4d0._M_string_length + local_5f8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d0._M_dataplus._M_p != paVar1) {
      uVar14 = local_4d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_4d0._M_string_length + local_5f8._M_string_length) goto LAB_00215e41;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_4d0,0,(char *)0x0,(ulong)local_5f8._M_dataplus._M_p);
  }
  else {
LAB_00215e41:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5f8,(ulong)local_4d0._M_dataplus._M_p);
  }
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_5d8.field_2._M_allocated_capacity = *puVar2;
    local_5d8.field_2._8_8_ = puVar11[3];
    local_5d8._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_5d8.field_2._M_allocated_capacity = *puVar2;
    local_5d8._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_5d8._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::externalVariableTypeString_abi_cxx11_(&local_4f0,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_4f0._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
      uVar14 = local_4f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_4f0._M_string_length + local_5d8._M_string_length) goto LAB_00215f04;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_4f0,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_00215f04:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_4f0._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::variableInfoObjectString_abi_cxx11_(&local_618,*(GeneratorProfile **)this);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::interfaceVoiInfoString_abi_cxx11_(&local_5d8,*(GeneratorProfile **)this);
  GeneratorProfile::implementationVoiInfoString_abi_cxx11_(&local_5f8,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != paVar5) {
      uVar14 = local_5f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) goto LAB_0021615b;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_5f8,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_0021615b:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_5f8._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::interfaceStateInfoString_abi_cxx11_(&local_5d8,*(GeneratorProfile **)this);
  GeneratorProfile::implementationStateInfoString_abi_cxx11_(&local_5f8,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != paVar5) {
      uVar14 = local_5f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) goto LAB_00216266;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_5f8,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_00216266:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_5f8._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::interfaceVariableInfoString_abi_cxx11_(&local_5d8,*(GeneratorProfile **)this);
  GeneratorProfile::implementationVariableInfoString_abi_cxx11_
            (&local_5f8,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != paVar5) {
      uVar14 = local_5f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) goto LAB_00216371;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_5f8,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_00216371:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_5f8._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::variableInfoEntryString_abi_cxx11_(&local_618,*(GeneratorProfile **)this);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::voiString_abi_cxx11_(&local_618,*(GeneratorProfile **)this);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::statesArrayString_abi_cxx11_(&local_5f8,*(GeneratorProfile **)this);
  GeneratorProfile::ratesArrayString_abi_cxx11_(&local_590,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    uVar14 = local_5f8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_590._M_string_length + local_5f8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_590._M_dataplus._M_p != &local_590.field_2) {
      uVar14 = local_590.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_590._M_string_length + local_5f8._M_string_length) goto LAB_002164f4;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_590,0,(char *)0x0,(ulong)local_5f8._M_dataplus._M_p);
  }
  else {
LAB_002164f4:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5f8,(ulong)local_590._M_dataplus._M_p);
  }
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_5d8.field_2._M_allocated_capacity = *puVar2;
    local_5d8.field_2._8_8_ = puVar11[3];
    local_5d8._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_5d8.field_2._M_allocated_capacity = *puVar2;
    local_5d8._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_5d8._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::variablesArrayString_abi_cxx11_(&local_5b0,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_5b0._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
      uVar14 = local_5b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_5b0._M_string_length + local_5d8._M_string_length) goto LAB_002165a8;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_5b0,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_002165a8:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_5b0._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::externalVariableMethodTypeDefinitionString_abi_cxx11_
            (&local_5d8,*(GeneratorProfile **)this,false);
  GeneratorProfile::externalVariableMethodTypeDefinitionString_abi_cxx11_
            (&local_5f8,*(GeneratorProfile **)this,true);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != paVar5) {
      uVar14 = local_5f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) goto LAB_002166fb;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_5f8,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_002166fb:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_5f8._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::externalVariableMethodCallString_abi_cxx11_
            (&local_5d8,*(GeneratorProfile **)this,false);
  GeneratorProfile::externalVariableMethodCallString_abi_cxx11_
            (&local_5f8,*(GeneratorProfile **)this,true);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != paVar5) {
      uVar14 = local_5f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) goto LAB_0021680d;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_5f8,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_0021680d:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_5f8._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::rootFindingInfoObjectString_abi_cxx11_
            (&local_450,*(GeneratorProfile **)this,false);
  GeneratorProfile::rootFindingInfoObjectString_abi_cxx11_
            (&local_470,*(GeneratorProfile **)this,true);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    uVar14 = local_450.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_470._M_string_length + local_450._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_dataplus._M_p != &local_470.field_2) {
      uVar14 = local_470.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_470._M_string_length + local_450._M_string_length) goto LAB_00216947;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_470,0,(char *)0x0,(ulong)local_450._M_dataplus._M_p);
  }
  else {
LAB_00216947:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_450,(ulong)local_470._M_dataplus._M_p);
  }
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_4b0.field_2._M_allocated_capacity = *puVar2;
    local_4b0.field_2._8_8_ = puVar11[3];
  }
  else {
    local_4b0.field_2._M_allocated_capacity = *puVar2;
    local_4b0._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_4b0._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::externNlaSolveMethodString_abi_cxx11_(&local_490,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    uVar14 = local_4b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_490._M_string_length + local_4b0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490._M_dataplus._M_p != &local_490.field_2) {
      uVar14 = local_490.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_490._M_string_length + local_4b0._M_string_length) goto LAB_00216a30;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_490,0,(char *)0x0,(ulong)local_4b0._M_dataplus._M_p);
  }
  else {
LAB_00216a30:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_4b0,(ulong)local_490._M_dataplus._M_p);
  }
  local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_4f0.field_2._M_allocated_capacity = *puVar2;
    local_4f0.field_2._8_8_ = puVar11[3];
  }
  else {
    local_4f0.field_2._M_allocated_capacity = *puVar2;
    local_4f0._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_4f0._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::findRootCallString_abi_cxx11_(&local_3d0,*(GeneratorProfile **)this,false);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    uVar14 = local_4f0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_3d0._M_string_length + local_4f0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
      uVar14 = local_3d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_3d0._M_string_length + local_4f0._M_string_length) goto LAB_00216b1b;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_3d0,0,(char *)0x0,(ulong)local_4f0._M_dataplus._M_p);
  }
  else {
LAB_00216b1b:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_4f0,(ulong)local_3d0._M_dataplus._M_p);
  }
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_4d0.field_2._M_allocated_capacity = *puVar2;
    local_4d0.field_2._8_8_ = puVar11[3];
    local_4d0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_4d0.field_2._M_allocated_capacity = *puVar2;
    local_4d0._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_4d0._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::findRootCallString_abi_cxx11_(&local_3f0,*(GeneratorProfile **)this,true);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != paVar1) {
    uVar14 = local_4d0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_3f0._M_string_length + local_4d0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      uVar14 = local_3f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_3f0._M_string_length + local_4d0._M_string_length) goto LAB_00216bfa;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_3f0,0,(char *)0x0,(ulong)local_4d0._M_dataplus._M_p);
  }
  else {
LAB_00216bfa:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_4d0,(ulong)local_3f0._M_dataplus._M_p);
  }
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_510.field_2._M_allocated_capacity = *puVar2;
    local_510.field_2._8_8_ = puVar11[3];
  }
  else {
    local_510.field_2._M_allocated_capacity = *puVar2;
    local_510._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_510._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::findRootMethodString_abi_cxx11_(&local_410,*(GeneratorProfile **)this,false);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    uVar14 = local_510.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_410._M_string_length + local_510._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      uVar14 = local_410.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_410._M_string_length + local_510._M_string_length) goto LAB_00216ce5;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_410,0,(char *)0x0,(ulong)local_510._M_dataplus._M_p);
  }
  else {
LAB_00216ce5:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_510,(ulong)local_410._M_dataplus._M_p);
  }
  local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_530.field_2._M_allocated_capacity = *puVar2;
    local_530.field_2._8_8_ = puVar11[3];
  }
  else {
    local_530.field_2._M_allocated_capacity = *puVar2;
    local_530._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_530._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::findRootMethodString_abi_cxx11_(&local_430,*(GeneratorProfile **)this,true);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    uVar14 = local_530.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_430._M_string_length + local_530._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      uVar14 = local_430.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_430._M_string_length + local_530._M_string_length) goto LAB_00216dd3;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_430,0,(char *)0x0,(ulong)local_530._M_dataplus._M_p);
  }
  else {
LAB_00216dd3:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_530,(ulong)local_430._M_dataplus._M_p);
  }
  local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_570.field_2._M_allocated_capacity = *puVar2;
    local_570.field_2._8_8_ = puVar11[3];
  }
  else {
    local_570.field_2._M_allocated_capacity = *puVar2;
    local_570._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_570._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::nlaSolveCallString_abi_cxx11_(&local_350,*(GeneratorProfile **)this,false);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    uVar14 = local_570.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_350._M_string_length + local_570._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      uVar14 = local_350.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_350._M_string_length + local_570._M_string_length) goto LAB_00216ebe;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_350,0,(char *)0x0,(ulong)local_570._M_dataplus._M_p);
  }
  else {
LAB_00216ebe:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_570,(ulong)local_350._M_dataplus._M_p);
  }
  local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_550.field_2._M_allocated_capacity = *puVar2;
    local_550.field_2._8_8_ = puVar11[3];
  }
  else {
    local_550.field_2._M_allocated_capacity = *puVar2;
    local_550._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_550._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::nlaSolveCallString_abi_cxx11_(&local_370,*(GeneratorProfile **)this,true);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    uVar14 = local_550.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_370._M_string_length + local_550._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      uVar14 = local_370.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_370._M_string_length + local_550._M_string_length) goto LAB_00216fac;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_370,0,(char *)0x0,(ulong)local_550._M_dataplus._M_p);
  }
  else {
LAB_00216fac:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_550,(ulong)local_370._M_dataplus._M_p);
  }
  local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_5b0.field_2._M_allocated_capacity = *puVar2;
    local_5b0.field_2._8_8_ = puVar11[3];
  }
  else {
    local_5b0.field_2._M_allocated_capacity = *puVar2;
    local_5b0._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_5b0._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::objectiveFunctionMethodString_abi_cxx11_
            (&local_390,*(GeneratorProfile **)this,false);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    uVar14 = local_5b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_390._M_string_length + local_5b0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      uVar14 = local_390.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_390._M_string_length + local_5b0._M_string_length) goto LAB_0021707c;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_390,0,(char *)0x0,(ulong)local_5b0._M_dataplus._M_p);
  }
  else {
LAB_0021707c:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5b0,(ulong)local_390._M_dataplus._M_p);
  }
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_590.field_2._M_allocated_capacity = *puVar2;
    local_590.field_2._8_8_ = puVar11[3];
  }
  else {
    local_590.field_2._M_allocated_capacity = *puVar2;
    local_590._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_590._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::objectiveFunctionMethodString_abi_cxx11_
            (&local_3b0,*(GeneratorProfile **)this,true);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    uVar14 = local_590.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_3b0._M_string_length + local_590._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      uVar14 = local_3b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_3b0._M_string_length + local_590._M_string_length) goto LAB_00217167;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_3b0,0,(char *)0x0,(ulong)local_590._M_dataplus._M_p);
  }
  else {
LAB_00217167:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_590,(ulong)local_3b0._M_dataplus._M_p);
  }
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_5f8.field_2._M_allocated_capacity = *puVar2;
    local_5f8.field_2._8_8_ = puVar11[3];
    local_5f8._M_dataplus._M_p = (pointer)paVar5;
  }
  else {
    local_5f8.field_2._M_allocated_capacity = *puVar2;
    local_5f8._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_5f8._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::uArrayString_abi_cxx11_(&local_310,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    uVar14 = local_5f8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_310._M_string_length + local_5f8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      uVar14 = local_310.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_310._M_string_length + local_5f8._M_string_length) goto LAB_0021722d;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_310,0,(char *)0x0,(ulong)local_5f8._M_dataplus._M_p);
  }
  else {
LAB_0021722d:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5f8,(ulong)local_310._M_dataplus._M_p);
  }
  puVar2 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_5d8.field_2._M_allocated_capacity = *puVar2;
    local_5d8.field_2._8_8_ = puVar11[3];
    local_5d8._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_5d8.field_2._M_allocated_capacity = *puVar2;
    local_5d8._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_5d8._M_string_length = puVar11[1];
  *puVar11 = puVar2;
  puVar11[1] = 0;
  *(undefined1 *)puVar2 = 0;
  GeneratorProfile::fArrayString_abi_cxx11_(&local_330,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_330._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      uVar14 = local_330.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_330._M_string_length + local_5d8._M_string_length) goto LAB_002172f0;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_330,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_002172f0:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_330._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::interfaceCreateStatesArrayMethodString_abi_cxx11_
            (&local_5d8,*(GeneratorProfile **)this);
  GeneratorProfile::implementationCreateStatesArrayMethodString_abi_cxx11_
            (&local_5f8,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != paVar5) {
      uVar14 = local_5f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) goto LAB_0021771b;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_5f8,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_0021771b:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_5f8._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::interfaceCreateVariablesArrayMethodString_abi_cxx11_
            (&local_5d8,*(GeneratorProfile **)this);
  GeneratorProfile::implementationCreateVariablesArrayMethodString_abi_cxx11_
            (&local_5f8,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != paVar5) {
      uVar14 = local_5f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) goto LAB_00217826;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_5f8,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_00217826:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_5f8._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::interfaceDeleteArrayMethodString_abi_cxx11_
            (&local_5d8,*(GeneratorProfile **)this);
  GeneratorProfile::implementationDeleteArrayMethodString_abi_cxx11_
            (&local_5f8,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != paVar5) {
      uVar14 = local_5f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) goto LAB_00217931;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_5f8,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_00217931:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_5f8._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::interfaceInitialiseVariablesMethodString_abi_cxx11_
            (&local_5d8,*(GeneratorProfile **)this,false,false);
  GeneratorProfile::implementationInitialiseVariablesMethodString_abi_cxx11_
            (&local_5f8,*(GeneratorProfile **)this,false,false);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != paVar5) {
      uVar14 = local_5f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) goto LAB_00217a44;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_5f8,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_00217a44:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_5f8._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::interfaceInitialiseVariablesMethodString_abi_cxx11_
            (&local_5d8,*(GeneratorProfile **)this,false,true);
  GeneratorProfile::implementationInitialiseVariablesMethodString_abi_cxx11_
            (&local_5f8,*(GeneratorProfile **)this,false,true);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != paVar5) {
      uVar14 = local_5f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) goto LAB_00217b5d;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_5f8,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_00217b5d:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_5f8._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::interfaceInitialiseVariablesMethodString_abi_cxx11_
            (&local_5d8,*(GeneratorProfile **)this,true,false);
  GeneratorProfile::implementationInitialiseVariablesMethodString_abi_cxx11_
            (&local_5f8,*(GeneratorProfile **)this,true,false);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != paVar5) {
      uVar14 = local_5f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) goto LAB_00217c76;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_5f8,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_00217c76:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_5f8._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::interfaceInitialiseVariablesMethodString_abi_cxx11_
            (&local_5d8,*(GeneratorProfile **)this,true,true);
  GeneratorProfile::implementationInitialiseVariablesMethodString_abi_cxx11_
            (&local_5f8,*(GeneratorProfile **)this,true,true);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != paVar5) {
      uVar14 = local_5f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) goto LAB_00217d95;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_5f8,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_00217d95:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_5f8._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::interfaceComputeComputedConstantsMethodString_abi_cxx11_
            (&local_5d8,*(GeneratorProfile **)this);
  GeneratorProfile::implementationComputeComputedConstantsMethodString_abi_cxx11_
            (&local_5f8,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != paVar5) {
      uVar14 = local_5f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) goto LAB_00217ea0;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_5f8,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_00217ea0:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_5f8._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::interfaceComputeRatesMethodString_abi_cxx11_
            (&local_5d8,*(GeneratorProfile **)this,false);
  GeneratorProfile::implementationComputeRatesMethodString_abi_cxx11_
            (&local_5f8,*(GeneratorProfile **)this,false);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != paVar5) {
      uVar14 = local_5f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) goto LAB_00217faf;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_5f8,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_00217faf:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_5f8._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::interfaceComputeRatesMethodString_abi_cxx11_
            (&local_5d8,*(GeneratorProfile **)this,true);
  GeneratorProfile::implementationComputeRatesMethodString_abi_cxx11_
            (&local_5f8,*(GeneratorProfile **)this,true);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != paVar5) {
      uVar14 = local_5f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) goto LAB_002180c4;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_5f8,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_002180c4:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_5f8._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::interfaceComputeVariablesMethodString_abi_cxx11_
            (&local_5d8,*(GeneratorProfile **)this,false,false);
  GeneratorProfile::implementationComputeVariablesMethodString_abi_cxx11_
            (&local_5f8,*(GeneratorProfile **)this,false,false);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != paVar5) {
      uVar14 = local_5f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) goto LAB_002181d7;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_5f8,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_002181d7:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_5f8._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::interfaceComputeVariablesMethodString_abi_cxx11_
            (&local_5d8,*(GeneratorProfile **)this,false,true);
  GeneratorProfile::implementationComputeVariablesMethodString_abi_cxx11_
            (&local_5f8,*(GeneratorProfile **)this,false,true);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != paVar5) {
      uVar14 = local_5f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) goto LAB_002182f0;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_5f8,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_002182f0:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_5f8._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::interfaceComputeVariablesMethodString_abi_cxx11_
            (&local_5d8,*(GeneratorProfile **)this,true,false);
  GeneratorProfile::implementationComputeVariablesMethodString_abi_cxx11_
            (&local_5f8,*(GeneratorProfile **)this,true,false);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != paVar5) {
      uVar14 = local_5f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) goto LAB_00218409;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_5f8,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_00218409:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_5f8._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::interfaceComputeVariablesMethodString_abi_cxx11_
            (&local_5d8,*(GeneratorProfile **)this,true,true);
  GeneratorProfile::implementationComputeVariablesMethodString_abi_cxx11_
            (&local_5f8,*(GeneratorProfile **)this,true,true);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != paVar5) {
      uVar14 = local_5f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) goto LAB_00218528;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_5f8,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_00218528:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_5f8._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::emptyMethodString_abi_cxx11_(&local_618,*(GeneratorProfile **)this);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::indentString_abi_cxx11_(&local_618,*(GeneratorProfile **)this);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::openArrayInitialiserString_abi_cxx11_(&local_5d8,*(GeneratorProfile **)this);
  GeneratorProfile::closeArrayInitialiserString_abi_cxx11_(&local_5f8,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != paVar5) {
      uVar14 = local_5f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) goto LAB_00218697;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_5f8,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
  }
  else {
LAB_00218697:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_5f8._M_dataplus._M_p);
  }
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::openArrayString_abi_cxx11_(&local_5d8,*(GeneratorProfile **)this);
  GeneratorProfile::closeArrayString_abi_cxx11_(&local_5f8,*(GeneratorProfile **)this);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    uVar14 = local_5d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_5f8._M_string_length + local_5d8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != paVar5) {
      uVar14 = local_5f8.field_2._M_allocated_capacity;
    }
    if (local_5f8._M_string_length + local_5d8._M_string_length <= (ulong)uVar14) {
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_5f8,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
      goto LAB_002187bc;
    }
  }
  puVar11 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_5f8._M_dataplus._M_p);
LAB_002187bc:
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618.field_2._8_8_ = puVar11[3];
    local_618._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_618.field_2._M_allocated_capacity = *psVar13;
    local_618._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_618._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::arrayElementSeparatorString_abi_cxx11_(&local_618,*(GeneratorProfile **)this);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::stringDelimiterString_abi_cxx11_(&local_618,*(GeneratorProfile **)this);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  GeneratorProfile::commandSeparatorString_abi_cxx11_(&local_618,*(GeneratorProfile **)this);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_618._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar3) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string generatorProfileAsString(const GeneratorProfilePtr &generatorProfile)
{
    // Whether the profile requires an interface to be generated.

    static const std::string TRUE_VALUE = "true";
    static const std::string FALSE_VALUE = "false";

    auto profileContents = generatorProfile->hasInterface() ?
                               TRUE_VALUE :
                               FALSE_VALUE;

    // Equality.

    profileContents += generatorProfile->equalityString();

    // Relational and logical operators.

    profileContents += generatorProfile->eqString()
                       + generatorProfile->neqString()
                       + generatorProfile->ltString()
                       + generatorProfile->leqString()
                       + generatorProfile->gtString()
                       + generatorProfile->geqString()
                       + generatorProfile->andString()
                       + generatorProfile->orString()
                       + generatorProfile->xorString()
                       + generatorProfile->notString();

    profileContents += (generatorProfile->hasEqOperator() ?
                            TRUE_VALUE :
                            FALSE_VALUE)
                       + (generatorProfile->hasNeqOperator() ?
                              TRUE_VALUE :
                              FALSE_VALUE)
                       + (generatorProfile->hasLtOperator() ?
                              TRUE_VALUE :
                              FALSE_VALUE)
                       + (generatorProfile->hasLeqOperator() ?
                              TRUE_VALUE :
                              FALSE_VALUE)
                       + (generatorProfile->hasGtOperator() ?
                              TRUE_VALUE :
                              FALSE_VALUE)
                       + (generatorProfile->hasGeqOperator() ?
                              TRUE_VALUE :
                              FALSE_VALUE)
                       + (generatorProfile->hasAndOperator() ?
                              TRUE_VALUE :
                              FALSE_VALUE)
                       + (generatorProfile->hasOrOperator() ?
                              TRUE_VALUE :
                              FALSE_VALUE)
                       + (generatorProfile->hasXorOperator() ?
                              TRUE_VALUE :
                              FALSE_VALUE)
                       + (generatorProfile->hasNotOperator() ?
                              TRUE_VALUE :
                              FALSE_VALUE);

    // Arithmetic operators.

    profileContents += generatorProfile->plusString()
                       + generatorProfile->minusString()
                       + generatorProfile->timesString()
                       + generatorProfile->divideString()
                       + generatorProfile->powerString()
                       + generatorProfile->squareRootString()
                       + generatorProfile->squareString()
                       + generatorProfile->absoluteValueString()
                       + generatorProfile->exponentialString()
                       + generatorProfile->naturalLogarithmString()
                       + generatorProfile->commonLogarithmString()
                       + generatorProfile->ceilingString()
                       + generatorProfile->floorString()
                       + generatorProfile->minString()
                       + generatorProfile->maxString()
                       + generatorProfile->remString();

    profileContents += generatorProfile->hasPowerOperator() ?
                           TRUE_VALUE :
                           FALSE_VALUE;

    // Trigonometric operators.

    profileContents += generatorProfile->sinString()
                       + generatorProfile->cosString()
                       + generatorProfile->tanString()
                       + generatorProfile->secString()
                       + generatorProfile->cscString()
                       + generatorProfile->cotString()
                       + generatorProfile->sinhString()
                       + generatorProfile->coshString()
                       + generatorProfile->tanhString()
                       + generatorProfile->sechString()
                       + generatorProfile->cschString()
                       + generatorProfile->cothString()
                       + generatorProfile->asinString()
                       + generatorProfile->acosString()
                       + generatorProfile->atanString()
                       + generatorProfile->asecString()
                       + generatorProfile->acscString()
                       + generatorProfile->acotString()
                       + generatorProfile->asinhString()
                       + generatorProfile->acoshString()
                       + generatorProfile->atanhString()
                       + generatorProfile->asechString()
                       + generatorProfile->acschString()
                       + generatorProfile->acothString();

    // Piecewise statement.

    profileContents += generatorProfile->conditionalOperatorIfString()
                       + generatorProfile->conditionalOperatorElseString()
                       + generatorProfile->piecewiseIfString()
                       + generatorProfile->piecewiseElseString();

    profileContents += generatorProfile->hasConditionalOperator() ?
                           TRUE_VALUE :
                           FALSE_VALUE;

    // Constants.

    profileContents += generatorProfile->trueString()
                       + generatorProfile->falseString()
                       + generatorProfile->eString()
                       + generatorProfile->piString()
                       + generatorProfile->infString()
                       + generatorProfile->nanString();

    // Arithmetic functions.

    profileContents += generatorProfile->eqFunctionString()
                       + generatorProfile->neqFunctionString()
                       + generatorProfile->ltFunctionString()
                       + generatorProfile->leqFunctionString()
                       + generatorProfile->gtFunctionString()
                       + generatorProfile->geqFunctionString()
                       + generatorProfile->andFunctionString()
                       + generatorProfile->orFunctionString()
                       + generatorProfile->xorFunctionString()
                       + generatorProfile->notFunctionString()
                       + generatorProfile->minFunctionString()
                       + generatorProfile->maxFunctionString();

    // Trigonometric functions.

    profileContents += generatorProfile->secFunctionString()
                       + generatorProfile->cscFunctionString()
                       + generatorProfile->cotFunctionString()
                       + generatorProfile->sechFunctionString()
                       + generatorProfile->cschFunctionString()
                       + generatorProfile->cothFunctionString()
                       + generatorProfile->asecFunctionString()
                       + generatorProfile->acscFunctionString()
                       + generatorProfile->acotFunctionString()
                       + generatorProfile->asechFunctionString()
                       + generatorProfile->acschFunctionString()
                       + generatorProfile->acothFunctionString();

    // Miscellaneous.
    // Note: we do NOT include interfaceFileNameString() since it may be the
    //       only thing that someone might change, so that the generated file
    //       works with the file name it is to be given.

    profileContents += generatorProfile->commentString()
                       + generatorProfile->originCommentString();

    profileContents += generatorProfile->interfaceHeaderString()
                       + generatorProfile->implementationHeaderString();

    profileContents += generatorProfile->interfaceVersionString()
                       + generatorProfile->implementationVersionString();

    profileContents += generatorProfile->interfaceLibcellmlVersionString()
                       + generatorProfile->implementationLibcellmlVersionString();

    profileContents += generatorProfile->interfaceStateCountString()
                       + generatorProfile->implementationStateCountString();

    profileContents += generatorProfile->interfaceVariableCountString()
                       + generatorProfile->implementationVariableCountString();

    profileContents += generatorProfile->variableTypeObjectString(false, false);
    profileContents += generatorProfile->variableTypeObjectString(false, true);
    profileContents += generatorProfile->variableTypeObjectString(true, false);
    profileContents += generatorProfile->variableTypeObjectString(true, true);

    profileContents += generatorProfile->variableOfIntegrationVariableTypeString()
                       + generatorProfile->stateVariableTypeString()
                       + generatorProfile->constantVariableTypeString()
                       + generatorProfile->computedConstantVariableTypeString()
                       + generatorProfile->algebraicVariableTypeString()
                       + generatorProfile->externalVariableTypeString();

    profileContents += generatorProfile->variableInfoObjectString();

    profileContents += generatorProfile->interfaceVoiInfoString()
                       + generatorProfile->implementationVoiInfoString();

    profileContents += generatorProfile->interfaceStateInfoString()
                       + generatorProfile->implementationStateInfoString();

    profileContents += generatorProfile->interfaceVariableInfoString()
                       + generatorProfile->implementationVariableInfoString();

    profileContents += generatorProfile->variableInfoEntryString();

    profileContents += generatorProfile->voiString();

    profileContents += generatorProfile->statesArrayString()
                       + generatorProfile->ratesArrayString()
                       + generatorProfile->variablesArrayString();

    profileContents += generatorProfile->externalVariableMethodTypeDefinitionString(false)
                       + generatorProfile->externalVariableMethodTypeDefinitionString(true);

    profileContents += generatorProfile->externalVariableMethodCallString(false)
                       + generatorProfile->externalVariableMethodCallString(true);

    profileContents += generatorProfile->rootFindingInfoObjectString(false)
                       + generatorProfile->rootFindingInfoObjectString(true)
                       + generatorProfile->externNlaSolveMethodString()
                       + generatorProfile->findRootCallString(false)
                       + generatorProfile->findRootCallString(true)
                       + generatorProfile->findRootMethodString(false)
                       + generatorProfile->findRootMethodString(true)
                       + generatorProfile->nlaSolveCallString(false)
                       + generatorProfile->nlaSolveCallString(true)
                       + generatorProfile->objectiveFunctionMethodString(false)
                       + generatorProfile->objectiveFunctionMethodString(true)
                       + generatorProfile->uArrayString()
                       + generatorProfile->fArrayString();

    profileContents += generatorProfile->interfaceCreateStatesArrayMethodString()
                       + generatorProfile->implementationCreateStatesArrayMethodString();

    profileContents += generatorProfile->interfaceCreateVariablesArrayMethodString()
                       + generatorProfile->implementationCreateVariablesArrayMethodString();

    profileContents += generatorProfile->interfaceDeleteArrayMethodString()
                       + generatorProfile->implementationDeleteArrayMethodString();

    profileContents += generatorProfile->interfaceInitialiseVariablesMethodString(false, false)
                       + generatorProfile->implementationInitialiseVariablesMethodString(false, false);

    profileContents += generatorProfile->interfaceInitialiseVariablesMethodString(false, true)
                       + generatorProfile->implementationInitialiseVariablesMethodString(false, true);

    profileContents += generatorProfile->interfaceInitialiseVariablesMethodString(true, false)
                       + generatorProfile->implementationInitialiseVariablesMethodString(true, false);

    profileContents += generatorProfile->interfaceInitialiseVariablesMethodString(true, true)
                       + generatorProfile->implementationInitialiseVariablesMethodString(true, true);

    profileContents += generatorProfile->interfaceComputeComputedConstantsMethodString()
                       + generatorProfile->implementationComputeComputedConstantsMethodString();

    profileContents += generatorProfile->interfaceComputeRatesMethodString(false)
                       + generatorProfile->implementationComputeRatesMethodString(false);

    profileContents += generatorProfile->interfaceComputeRatesMethodString(true)
                       + generatorProfile->implementationComputeRatesMethodString(true);

    profileContents += generatorProfile->interfaceComputeVariablesMethodString(false, false)
                       + generatorProfile->implementationComputeVariablesMethodString(false, false);

    profileContents += generatorProfile->interfaceComputeVariablesMethodString(false, true)
                       + generatorProfile->implementationComputeVariablesMethodString(false, true);

    profileContents += generatorProfile->interfaceComputeVariablesMethodString(true, false)
                       + generatorProfile->implementationComputeVariablesMethodString(true, false);

    profileContents += generatorProfile->interfaceComputeVariablesMethodString(true, true)
                       + generatorProfile->implementationComputeVariablesMethodString(true, true);

    profileContents += generatorProfile->emptyMethodString();

    profileContents += generatorProfile->indentString();

    profileContents += generatorProfile->openArrayInitialiserString()
                       + generatorProfile->closeArrayInitialiserString();

    profileContents += generatorProfile->openArrayString()
                       + generatorProfile->closeArrayString();

    profileContents += generatorProfile->arrayElementSeparatorString();

    profileContents += generatorProfile->stringDelimiterString();

    profileContents += generatorProfile->commandSeparatorString();

    return profileContents;
}